

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall despot::TagManhattanUpperBound::Value(TagManhattanUpperBound *this)

{
  Belief *in_RSI;
  
  Value((TagManhattanUpperBound *)
        &this[-1].value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage,in_RSI);
  return;
}

Assistant:

double Value(const Belief* belief) const {
		const vector<State*>& particles =
			static_cast<const ParticleBelief*>(belief)->particles();

		double value = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			const TagState* state = static_cast<const TagState*>(particle);
			value += state->weight * value_[state->state_id];
		}
		return value;
	}